

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

size_t destroy_mspace(mspace msp)

{
  uint *puVar1;
  void *__addr;
  size_t __len;
  int iVar2;
  flag_t flag;
  size_t size;
  char *base;
  msegmentptr sp;
  mstate ms;
  size_t freed;
  mspace msp_local;
  
  ms = (mstate)0x0;
  base = (char *)((long)msp + 0x378);
  while (base != (char *)0x0) {
    __addr = *(void **)base;
    __len = *(size_t *)(base + 8);
    puVar1 = (uint *)(base + 0x18);
    base = *(char **)(base + 0x10);
    if ((((*puVar1 & 1) != 0) && ((*puVar1 & 8) == 0)) && (iVar2 = munmap(__addr,__len), iVar2 == 0)
       ) {
      ms = (mstate)((long)ms->smallbins + (__len - 0x48));
    }
  }
  return (size_t)ms;
}

Assistant:

size_t destroy_mspace(mspace msp) {
  size_t freed = 0;
  mstate ms = (mstate)msp;
  if (ok_magic(ms)) {
    msegmentptr sp = &ms->seg;
    (void)DESTROY_LOCK(&ms->mutex); /* destroy before unmapped */
    while (sp != 0) {
      char* base = sp->base;
      size_t size = sp->size;
      flag_t flag = sp->sflags;
      (void)base; /* placate people compiling -Wunused-variable */
      sp = sp->next;
      if ((flag & USE_MMAP_BIT) && !(flag & EXTERN_BIT) &&
          CALL_MUNMAP(base, size) == 0)
        freed += size;
    }
  }
  else {
    USAGE_ERROR_ACTION(ms,ms);
  }
  return freed;
}